

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalyzedAssertion.cpp
# Opt level: O2

VisitResult * __thiscall
slang::analysis::ClockVisitor::visit
          (VisitResult *__return_storage_ptr__,ClockVisitor *this,SequenceConcatExpr *expr,
          Clock outerClock,bitmask<slang::analysis::VisitFlags> flags)

{
  uint uVar1;
  pointer pEVar2;
  VisitResult *pVVar3;
  bool bVar4;
  bool isMulticlockedSeq;
  long lVar5;
  TimingControl *right;
  Clock endClock;
  byte bVar6;
  TimingControl *expr_00;
  SourceRange opRange;
  VisitResult result;
  TimingControl *local_98;
  bitmask<slang::analysis::VisitFlags> local_84;
  VisitResult *local_80;
  long local_78;
  Clock local_70;
  VisitResult local_68;
  
  pEVar2 = (expr->elements)._M_ptr;
  local_78 = (expr->elements)._M_extent._M_extent_value * 0x28;
  lVar5 = 0;
  isMulticlockedSeq = false;
  bVar6 = 0;
  expr_00 = (TimingControl *)0x0;
  endClock = (Clock)0x0;
  local_98 = (TimingControl *)0x0;
  local_80 = __return_storage_ptr__;
  local_70 = outerClock;
  do {
    pVVar3 = local_80;
    if (local_78 == lVar5) {
      if (local_98 == (TimingControl *)0x0) {
        local_80->endClock = (Clock)0x0;
        *(undefined8 *)&local_80->isMulticlockedSeq = 0;
        (local_80->clocks).super_SmallVectorBase<const_slang::ast::TimingControl_*>.firstElement[0]
             = '\0';
        (local_80->clocks).super_SmallVectorBase<const_slang::ast::TimingControl_*>.firstElement[1]
             = '\0';
        (local_80->clocks).super_SmallVectorBase<const_slang::ast::TimingControl_*>.firstElement[2]
             = '\0';
        (local_80->clocks).super_SmallVectorBase<const_slang::ast::TimingControl_*>.firstElement[3]
             = '\0';
        (local_80->clocks).super_SmallVectorBase<const_slang::ast::TimingControl_*>.firstElement[4]
             = '\0';
        (local_80->clocks).super_SmallVectorBase<const_slang::ast::TimingControl_*>.firstElement[5]
             = '\0';
        (local_80->clocks).super_SmallVectorBase<const_slang::ast::TimingControl_*>.firstElement[6]
             = '\0';
        (local_80->clocks).super_SmallVectorBase<const_slang::ast::TimingControl_*>.firstElement[7]
             = '\0';
        (local_80->clocks).stackBase[0] = '\0';
        (local_80->clocks).stackBase[1] = '\0';
        (local_80->clocks).stackBase[2] = '\0';
        (local_80->clocks).stackBase[3] = '\0';
        (local_80->clocks).stackBase[4] = '\0';
        (local_80->clocks).stackBase[5] = '\0';
        (local_80->clocks).stackBase[6] = '\0';
        (local_80->clocks).stackBase[7] = '\0';
        (local_80->clocks).super_SmallVectorBase<const_slang::ast::TimingControl_*>.data_ =
             (pointer)(local_80->clocks).super_SmallVectorBase<const_slang::ast::TimingControl_*>.
                      firstElement;
        (local_80->clocks).super_SmallVectorBase<const_slang::ast::TimingControl_*>.len = 0;
        (local_80->clocks).super_SmallVectorBase<const_slang::ast::TimingControl_*>.cap = 2;
        local_80->isMulticlockedSeq = false;
      }
      else {
        VisitResult::VisitResult(local_80,local_98,isMulticlockedSeq,endClock);
      }
      return pVVar3;
    }
    right = *(TimingControl **)((long)&(pEVar2->sequence).ptr + lVar5);
    local_84.m_bits = flags.m_bits | 1;
    ast::AssertionExpr::
    visit<slang::analysis::ClockVisitor,slang::ast::TimingControl_const*&,slang::bitmask<slang::analysis::VisitFlags>>
              (&local_68,(AssertionExpr *)right,this,&local_70,&local_84);
    if (local_68.clocks.super_SmallVectorBase<const_slang::ast::TimingControl_*>.len != 0) {
      endClock = local_68.endClock;
      if (local_68.endClock == (Clock)0x0) {
        endClock = local_68.clocks.super_SmallVectorBase<const_slang::ast::TimingControl_*>.data_
                   [local_68.clocks.super_SmallVectorBase<const_slang::ast::TimingControl_*>.len - 1
                   ];
      }
      if (local_98 == (TimingControl *)0x0) {
        local_98 = *local_68.clocks.super_SmallVectorBase<const_slang::ast::TimingControl_*>.data_;
      }
      else {
        if (local_68.isMulticlockedSeq == false) {
          right = *local_68.clocks.super_SmallVectorBase<const_slang::ast::TimingControl_*>.data_;
          bVar4 = isSameClock(local_98,right);
          if (bVar4) goto LAB_00320be8;
        }
        if ((bVar6 & 1) == 0) {
          right = expr_00;
          requireOnlyNonEmptyMatch(this,(AssertionExpr *)expr_00);
        }
        if (local_68.isMulticlockedSeq == false) {
          right = *(TimingControl **)((long)&(pEVar2->sequence).ptr + lVar5);
          requireOnlyNonEmptyMatch(this,(AssertionExpr *)right);
        }
        uVar1 = *(uint *)((long)&(pEVar2->delay).min + lVar5);
        if (((uVar1 < 2) &&
            (*(char *)((long)&(pEVar2->delay).max.super__Optional_base<unsigned_int,_true,_true>.
                              _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged +
                      lVar5) == '\x01')) &&
           (*(uint *)((long)&(pEVar2->delay).max.super__Optional_base<unsigned_int,_true,_true>.
                             _M_payload.super__Optional_payload_base<unsigned_int>._M_payload +
                     lVar5) == uVar1)) {
          isMulticlockedSeq = true;
        }
        else {
          right = *(TimingControl **)((long)&(pEVar2->sequence).ptr + lVar5);
          isMulticlockedSeq = true;
          opRange.endLoc = *(SourceLocation *)(&(pEVar2->delayRange).endLoc.field_0x0 + lVar5);
          opRange.startLoc = *(SourceLocation *)(&(pEVar2->delayRange).startLoc.field_0x0 + lVar5);
          badMulticlockedSeq(this,(AssertionExpr *)right,(AssertionExpr *)expr_00,opRange);
        }
      }
    }
LAB_00320be8:
    bVar6 = local_68.isMulticlockedSeq;
    expr_00 = *(TimingControl **)((long)&(pEVar2->sequence).ptr + lVar5);
    SmallVectorBase<const_slang::ast::TimingControl_*>::cleanup
              ((SmallVectorBase<const_slang::ast::TimingControl_*> *)&local_68,(EVP_PKEY_CTX *)right
              );
    lVar5 = lVar5 + 0x28;
  } while( true );
}

Assistant:

VisitResult visit(const SequenceConcatExpr& expr, Clock outerClock, bitmask<VF> flags) {
        Clock firstClock = nullptr;
        Clock endClock = nullptr;
        const AssertionExpr* lastExpr = nullptr;
        bool lastWasMulticlocked = false;
        bool isMulticlockedSeq = false;

        for (auto& elem : expr.elements) {
            auto result = elem.sequence->visit(*this, outerClock, flags | VF::RequireSequence);
            if (!result.clocks.empty()) {
                endClock = result.endClock == nullptr ? result.clocks.back() : result.endClock;
                if (!firstClock) {
                    firstClock = result.clocks[0];
                }
                else if (result.isMulticlockedSeq || !isSameClock(*firstClock, *result.clocks[0])) {
                    // When concatenating differently clocked sequences, the maximal single-clocked
                    // subsequences must not admit an empty match.
                    if (!lastWasMulticlocked)
                        requireOnlyNonEmptyMatch(*lastExpr);
                    if (!result.isMulticlockedSeq)
                        requireOnlyNonEmptyMatch(*elem.sequence);

                    isMulticlockedSeq = true;
                    if (elem.delay.min > 1 || elem.delay.max != elem.delay.min)
                        badMulticlockedSeq(*elem.sequence, *lastExpr, elem.delayRange);
                }
            }
            lastExpr = elem.sequence;
            lastWasMulticlocked = result.isMulticlockedSeq;
        }

        if (!firstClock)
            return {};

        return {firstClock, isMulticlockedSeq, endClock};
    }